

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_fast_class_base_definitions(writer *w,TypeDef *type)

{
  bool bVar1;
  TypeDef *args_1;
  string_view sVar2;
  coded_index<winmd::reader::TypeDefOrRef> cVar3;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> local_128;
  type *local_108;
  type *info;
  type *name;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
  local_f0;
  iterator __end2;
  iterator __begin2;
  get_interfaces_t *__range2;
  char *local_b8;
  table_base *local_b0;
  uint32_t local_a8;
  coded_index<winmd::reader::TypeDefOrRef> local_a0 [2];
  string_view local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  char *local_60;
  char *format;
  TypeDef *base;
  __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  local_48;
  iterator __end1;
  iterator __begin1;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *__range1;
  TypeDef *type_local;
  writer *w_local;
  
  bVar1 = has_fastabi(type);
  if (bVar1) {
    get_bases((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)&__begin1,
              type);
    __end1 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::begin
                       ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                        &__begin1);
    local_48._M_current =
         (TypeDef *)
         std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::end
                   ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                    &__begin1);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end1,&local_48);
      if (!bVar1) break;
      format = (char *)__gnu_cxx::
                       __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                       ::operator*(&__end1);
      local_60 = 
      "    inline %::operator impl::producer_ref<%> const() const noexcept\n    {\n        return { (*(impl::abi_t<%>**)this)->base_%() };\n    }\n"
      ;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_70,
                 "    inline %::operator impl::producer_ref<%> const() const noexcept\n    {\n        return { (*(impl::abi_t<%>**)this)->base_%() };\n    }\n"
                );
      sVar2 = winmd::reader::TypeDef::TypeName(type);
      args_1 = (TypeDef *)format;
      local_80 = sVar2;
      cVar3 = get_default_interface(type);
      local_b0 = cVar3.super_typed_index<winmd::reader::TypeDefOrRef>.
                 super_index_base<winmd::reader::TypeDefOrRef>.m_table;
      local_a8 = cVar3.super_typed_index<winmd::reader::TypeDefOrRef>.
                 super_index_base<winmd::reader::TypeDefOrRef>.m_value;
      local_a0[0].super_typed_index<winmd::reader::TypeDefOrRef>.
      super_index_base<winmd::reader::TypeDefOrRef>.m_table = local_b0;
      local_a0[0].super_typed_index<winmd::reader::TypeDefOrRef>.
      super_index_base<winmd::reader::TypeDefOrRef>.m_value = local_a8;
      sVar2 = winmd::reader::TypeDef::TypeName((TypeDef *)format);
      local_b8 = sVar2._M_str;
      __range2 = (get_interfaces_t *)sVar2._M_len;
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_70,&local_80,args_1,local_a0,
                 (basic_string_view<char,_std::char_traits<char>_> *)&__range2);
      get_interfaces_abi_cxx11_((get_interfaces_t *)&__begin2,(cppwinrt *)w,(writer *)format,args_1)
      ;
      __end2 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
               ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                        *)&__begin2);
      local_f0._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
              ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                     *)&__begin2);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end2,&local_f0);
        if (!bVar1) break;
        name = &__gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
                ::operator*(&__end2)->first;
        info = (type *)::std::get<0ul,std::__cxx11::string,cppwinrt::interface_info>
                                 ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                                   *)name);
        local_108 = ::std::get<1ul,std::__cxx11::string,cppwinrt::interface_info>
                              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                                *)name);
        if ((local_108->fastabi & 1U) == 0) break;
        winmd::reader::TypeDef::MethodList(&local_128,&local_108->type);
        writer_base<cppwinrt::writer>::
        write_each<&cppwinrt::write_consume_fast_base_definition,_std::pair<winmd::reader::MethodDef,_winmd::reader::MethodDef>,_winmd::reader::TypeDef,_winmd::reader::TypeDef>
                  (&w->super_writer_base<cppwinrt::writer>,&local_128,type,(TypeDef *)format);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
        ::operator++(&__end2);
      }
      base._4_4_ = 4;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                 *)&__begin2);
      __gnu_cxx::
      __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
      ::operator++(&__end1);
    }
    base._4_4_ = 2;
    std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::~vector
              ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)&__begin1)
    ;
  }
  return;
}

Assistant:

static void write_fast_class_base_definitions(writer& w, TypeDef const& type)
    {
        if (!has_fastabi(type))
        {
            return;
        }

        for (auto&& base : get_bases(type))
        {
            auto format = R"(    inline %::operator impl::producer_ref<%> const() const noexcept
    {
        return { (*(impl::abi_t<%>**)this)->base_%() };
    }
)";

            w.write(format, type.TypeName(), base, get_default_interface(type), base.TypeName());

            for (auto&& [name, info] : get_interfaces(w, base))
            {
                if (!info.fastabi)
                {
                    break;
                }

                w.write_each<write_consume_fast_base_definition>(info.type.MethodList(), type, base);
            }
        }
    }